

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O2

void Dar_LibAddNode(Dar_Lib_t *p,int Id0,int Id1,int fCompl0,int fCompl1)

{
  int iVar1;
  Dar_LibObj_t *pDVar2;
  Dar_LibObj_t DVar3;
  Dar_LibObj_t DVar4;
  ulong uVar5;
  ulong uVar6;
  
  pDVar2 = p->pObjs;
  iVar1 = p->iObj;
  p->iObj = iVar1 + 1;
  DVar3 = pDVar2[iVar1];
  uVar5 = CONCAT44(fCompl0,Id0 & 0xffffU | Id1 << 0x10) & 0x1ffffffff | (ulong)(fCompl1 & 1) << 0x21
  ;
  pDVar2[iVar1] = (Dar_LibObj_t)(uVar5 | (ulong)DVar3 & 0xfffffffc00000000);
  uVar6 = (ulong)((SUB84(pDVar2[Id1],4) >> 2 ^ fCompl1) & (SUB84(pDVar2[Id0],4) >> 2 ^ fCompl0) & 1)
          << 0x22;
  pDVar2[iVar1] = (Dar_LibObj_t)(uVar5 | (ulong)DVar3 & 0xfffffff800000000 | uVar6);
  DVar4 = (Dar_LibObj_t)~(ulong)pDVar2[Id1];
  if (fCompl1 == 0) {
    DVar4 = pDVar2[Id1];
  }
  pDVar2[iVar1] =
       (Dar_LibObj_t)
       (uVar5 | (ulong)DVar3 & 0x800000000 | uVar6 |
       (-(ulong)(fCompl0 != 0) ^ (ulong)pDVar2[Id0]) & 0xffff000000000 & (ulong)DVar4);
  return;
}

Assistant:

void Dar_LibAddNode( Dar_Lib_t * p, int Id0, int Id1, int fCompl0, int fCompl1 )
{
    Dar_LibObj_t * pFan0 = Dar_LibObj( p, Id0 );
    Dar_LibObj_t * pFan1 = Dar_LibObj( p, Id1 );
    Dar_LibObj_t * pObj  = p->pObjs + p->iObj++;
    pObj->Fan0 = Id0;
    pObj->Fan1 = Id1;
    pObj->fCompl0 = fCompl0;
    pObj->fCompl1 = fCompl1;
    pObj->fPhase = (fCompl0 ^ pFan0->fPhase) & (fCompl1 ^ pFan1->fPhase);
    pObj->Num = 0xFFFF & (fCompl0? ~pFan0->Num : pFan0->Num) & (fCompl1? ~pFan1->Num : pFan1->Num);
}